

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O1

sftp_request * sftp_alloc_request(void)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  void *pvVar4;
  sftp_request *e;
  uint index;
  uint uVar5;
  uint i;
  uint local_1c;
  
  if (sftp_requests == (tree234 *)0x0) {
    sftp_requests = newtree234(sftp_reqcmp);
  }
  uVar2 = count234(sftp_requests);
  uVar5 = 0x100;
  if (uVar2 - 1 < 0xfffffffe) {
    uVar5 = 0xffffffff;
    do {
      index = uVar5 + uVar2 >> 1;
      piVar3 = (int *)index234(sftp_requests,index);
      uVar1 = index;
      if (*piVar3 != index + 0x100) {
        uVar1 = uVar5;
        uVar2 = index;
      }
      uVar5 = uVar1;
    } while (1 < uVar2 - uVar5);
    uVar5 = uVar5 + 0x101;
  }
  local_1c = uVar5;
  pvVar4 = find234(sftp_requests,&local_1c,sftp_reqfind);
  if (pvVar4 != (void *)0x0) {
    __assert_fail("NULL == find234(sftp_requests, &i, sftp_reqfind)",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/sftp.c",
                  0x88,"struct sftp_request *sftp_alloc_request(void)");
  }
  e = (sftp_request *)safemalloc(1,0x10,0);
  e->id = uVar5;
  e->registered = false;
  e->userdata = (void *)0x0;
  add234(sftp_requests,e);
  return e;
}

Assistant:

static struct sftp_request *sftp_alloc_request(void)
{
    unsigned low, high, mid;
    int tsize;
    struct sftp_request *r;

    if (sftp_requests == NULL)
        sftp_requests = newtree234(sftp_reqcmp);

    /*
     * First-fit allocation of request IDs: always pick the lowest
     * unused one. To do this, binary-search using the counted
     * B-tree to find the largest ID which is in a contiguous
     * sequence from the beginning. (Precisely everything in that
     * sequence must have ID equal to its tree index plus
     * REQUEST_ID_OFFSET.)
     */
    tsize = count234(sftp_requests);

    low = -1;
    high = tsize;
    while (high - low > 1) {
        mid = (high + low) / 2;
        r = index234(sftp_requests, mid);
        if (r->id == mid + REQUEST_ID_OFFSET)
            low = mid;                 /* this one is fine */
        else
            high = mid;                /* this one is past it */
    }
    /*
     * Now low points to either -1, or the tree index of the
     * largest ID in the initial sequence.
     */
    {
        unsigned i = low + 1 + REQUEST_ID_OFFSET;
        assert(NULL == find234(sftp_requests, &i, sftp_reqfind));
    }

    /*
     * So the request ID we need to create is
     * low + 1 + REQUEST_ID_OFFSET.
     */
    r = snew(struct sftp_request);
    r->id = low + 1 + REQUEST_ID_OFFSET;
    r->registered = false;
    r->userdata = NULL;
    add234(sftp_requests, r);
    return r;
}